

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall
section_data::slice_horiz_horiz(section_data *this,int *line_start,int *line_end,int *layer)

{
  int iVar1;
  int iVar2;
  intercept_data intercept;
  intercept_data intercept_00;
  intercept_data intercept_01;
  intercept_data intercept_02;
  intercept_data intercept_03;
  intercept_data intercept_04;
  intercept_data intercept_05;
  intercept_data intercept_06;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  intercept_data tempy;
  int xb;
  int xa;
  int *layer_local;
  int *line_end_local;
  int *line_start_local;
  section_data *this_local;
  
  iVar1 = *line_start;
  iVar2 = *line_end;
  if ((line_start[1] == this->y1) && ((iVar1 <= this->x2 || (this->x1 < iVar2)))) {
    if (iVar1 == this->x1) {
      uVar3 = this->x1;
      uVar4 = this->y1;
      intercept_06.y = uVar4;
      intercept_06.x = uVar3;
      intercept_06.dist = 0;
      push_intercept(this,layer,intercept_06);
    }
    if (iVar1 == this->x2) {
      uVar5 = this->x2;
      uVar6 = this->y2;
      intercept_05.y = uVar6;
      intercept_05.x = uVar5;
      intercept_05.dist = this->x2 - this->x1;
      push_intercept(this,layer,intercept_05);
    }
    if (iVar2 == this->x1) {
      uVar7 = this->x1;
      uVar8 = this->y1;
      intercept_04.y = uVar8;
      intercept_04.x = uVar7;
      intercept_04.dist = 0;
      push_intercept(this,layer,intercept_04);
    }
    if (iVar2 == this->x2) {
      uVar9 = this->x2;
      uVar10 = this->y2;
      intercept_03.y = uVar10;
      intercept_03.x = uVar9;
      intercept_03.dist = this->x2 - this->x1;
      push_intercept(this,layer,intercept_03);
    }
    if ((this->x1 < iVar1) && (iVar1 < this->x2)) {
      intercept_02.y = this->y2;
      intercept_02.x = iVar1;
      intercept_02.dist = iVar1 - this->x1;
      push_intercept(this,layer,intercept_02);
    }
    if ((this->x1 < iVar2) && (iVar2 < this->x2)) {
      intercept_01.y = this->y2;
      intercept_01.x = iVar2;
      intercept_01.dist = iVar2 - this->x1;
      push_intercept(this,layer,intercept_01);
    }
    if ((iVar1 < this->x1) && (this->x1 < iVar2)) {
      intercept_00.y = this->y2;
      intercept_00.x = this->x1;
      intercept_00.dist = 0;
      push_intercept(this,layer,intercept_00);
    }
    if ((iVar1 < this->x2) && (this->x2 < iVar2)) {
      uVar11 = this->x2;
      uVar12 = this->y2;
      intercept.y = uVar12;
      intercept.x = uVar11;
      intercept.dist = this->x2 - this->x1;
      push_intercept(this,layer,intercept);
    }
  }
  return 0;
}

Assistant:

int section_data::slice_horiz_horiz(int line_start[2], int line_end[2],
                                    int &layer)
{
  int xa = line_start[0];
  int xb = line_end[0];
  intercept_data tempy;
  if (line_start[1] == y1) // Lines could interact only if on same height
  {
    if ((xa <= x2) || (x1 < xb)) // Lines have some interaction
    {
      if (xa == x1) {
        tempy.x = x1;
        tempy.y = y1;
        tempy.dist = 0;
        push_intercept(layer, tempy);
      }
      if (xa == x2) {
        tempy.x = x2;
        tempy.y = y2;
        tempy.dist = x2 - x1;
        push_intercept(layer, tempy);
      }
      if (xb == x1) {
        tempy.x = x1;
        tempy.y = y1;
        tempy.dist = 0;
        push_intercept(layer, tempy);
      }
      if (xb == x2) {
        tempy.x = x2;
        tempy.y = y2;
        tempy.dist = x2 - x1;
        push_intercept(layer, tempy);
      }
      if ((xa > x1) && (xa < x2)) {
        tempy.x = xa;
        tempy.y = y2;
        tempy.dist = xa - x1;
        push_intercept(layer, tempy);
      }
      if ((xb > x1) && (xb < x2)) {
        tempy.x = xb;
        tempy.y = y2;
        tempy.dist = xb - x1;
        push_intercept(layer, tempy);
      }
      if ((x1 > xa) && (x1 < xb)) {
        tempy.x = x1;
        tempy.y = y2;
        tempy.dist = 0;
        push_intercept(layer, tempy);
      }
      if ((x2 > xa) && (x2 < xb)) {
        tempy.x = x2;
        tempy.y = y2;
        tempy.dist = x2 - x1;
        push_intercept(layer, tempy);
      }
    }
  }
  return EXIT_SUCCESS;
}